

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,GLenum e)

{
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  string *extraout_RAX_03;
  string *extraout_RAX_04;
  string *extraout_RAX_05;
  string *extraout_RAX_06;
  string *extraout_RAX_07;
  string *extraout_RAX_08;
  string *extraout_RAX_09;
  string *extraout_RAX_10;
  string *extraout_RAX_11;
  string *extraout_RAX_12;
  string *extraout_RAX_13;
  string *extraout_RAX_14;
  string *extraout_RAX_15;
  string *extraout_RAX_16;
  string *extraout_RAX_17;
  string *extraout_RAX_18;
  string *extraout_RAX_19;
  string *extraout_RAX_20;
  string *extraout_RAX_21;
  string *extraout_RAX_22;
  string *extraout_RAX_23;
  string *extraout_RAX_24;
  string *extraout_RAX_25;
  string *extraout_RAX_26;
  string *extraout_RAX_27;
  string *extraout_RAX_28;
  string *extraout_RAX_29;
  string *extraout_RAX_30;
  string *extraout_RAX_31;
  string *extraout_RAX_32;
  string *extraout_RAX_33;
  string *extraout_RAX_34;
  string *extraout_RAX_35;
  string *extraout_RAX_36;
  string *extraout_RAX_37;
  int iVar1;
  
  iVar1 = (int)this;
  if (iVar1 < 0x8814) {
    if (iVar1 < 0x8229) {
      if (iVar1 == 0x8058) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"rgba8","")
        ;
        return extraout_RAX_29;
      }
      if (iVar1 == 0x8059) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"rgb10_a2","");
        return extraout_RAX_27;
      }
      if (iVar1 == 0x805b) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"rgba16","");
        return extraout_RAX_03;
      }
    }
    else {
      switch(iVar1) {
      case 0x8229:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"r8","");
        return extraout_RAX;
      case 0x822a:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"r16","");
        return extraout_RAX_26;
      case 0x822b:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"rg8","");
        return extraout_RAX_22;
      case 0x822c:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"rg16","");
        return extraout_RAX_24;
      case 0x822d:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"r16f","");
        return extraout_RAX_19;
      case 0x822e:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"r32f","");
        return extraout_RAX_30;
      case 0x822f:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"rg16f","")
        ;
        return extraout_RAX_32;
      case 0x8230:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"rg32f","")
        ;
        return extraout_RAX_25;
      case 0x8231:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"r8i","");
        return extraout_RAX_35;
      case 0x8232:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"r8ui","");
        return extraout_RAX_21;
      case 0x8233:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"r16i","");
        return extraout_RAX_34;
      case 0x8234:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"r16ui","")
        ;
        return extraout_RAX_18;
      case 0x8235:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"r32i","");
        return extraout_RAX_20;
      case 0x8236:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"r32ui","")
        ;
        return extraout_RAX_31;
      case 0x8237:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"rg8i","");
        return extraout_RAX_13;
      case 0x8238:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"rg8ui","")
        ;
        return extraout_RAX_23;
      case 0x8239:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"rg16i","")
        ;
        return extraout_RAX_12;
      case 0x823a:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"rg16ui","");
        return extraout_RAX_28;
      case 0x823b:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"rg32i","")
        ;
        return extraout_RAX_33;
      case 0x823c:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"rg32ui","");
        return extraout_RAX_36;
      }
    }
  }
  else if (iVar1 < 0x8d8e) {
    if (iVar1 < 0x8d76) {
      if (iVar1 < 0x8c3a) {
        if (iVar1 == 0x8814) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"rgba32f","");
          return extraout_RAX_14;
        }
        if (iVar1 == 0x881a) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"rgba16f","");
          return extraout_RAX_00;
        }
      }
      else {
        if (iVar1 == 0x8c3a) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"r11f_g11f_b10f","");
          return extraout_RAX_16;
        }
        if (iVar1 == 0x8d70) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"rgba32ui","");
          return extraout_RAX_05;
        }
      }
    }
    else if (iVar1 < 0x8d82) {
      if (iVar1 == 0x8d76) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"rgba16ui","");
        return extraout_RAX_15;
      }
      if (iVar1 == 0x8d7c) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"rgba8ui","");
        return extraout_RAX_02;
      }
    }
    else {
      if (iVar1 == 0x8d82) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"rgba32i","");
        return extraout_RAX_17;
      }
      if (iVar1 == 0x8d88) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"rgba16i","");
        return extraout_RAX_06;
      }
    }
  }
  else {
    switch(iVar1) {
    case 0x8f94:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"r8_snorm","");
      return extraout_RAX_01;
    case 0x8f95:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"rg8_snorm","");
      return extraout_RAX_09;
    case 0x8f96:
    case 0x8f9a:
      break;
    case 0x8f97:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"rgba8_snorm","");
      return extraout_RAX_08;
    case 0x8f98:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"r16_snorm","");
      return extraout_RAX_07;
    case 0x8f99:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"rg16_snorm","");
      return extraout_RAX_10;
    case 0x8f9b:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"rgba16_snorm","");
      return extraout_RAX_11;
    default:
      if (iVar1 == 0x8d8e) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"rgba8i","");
        return extraout_RAX_37;
      }
      if (iVar1 == 0x906f) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"rgb10_a2ui","");
        return extraout_RAX_04;
      }
    }
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                ,0x244,
                "std::string gl4cts::(anonymous namespace)::ShaderImageLoadStoreBase::FormatEnumToString(GLenum)"
               );
}

Assistant:

std::string FormatEnumToString(GLenum e)
	{
		switch (e)
		{
		case GL_RGBA32F:
			return "rgba32f";
		case GL_RGBA16F:
			return "rgba16f";
		case GL_RG32F:
			return "rg32f";
		case GL_RG16F:
			return "rg16f";
		case GL_R11F_G11F_B10F:
			return "r11f_g11f_b10f";
		case GL_R32F:
			return "r32f";
		case GL_R16F:
			return "r16f";

		case GL_RGBA32UI:
			return "rgba32ui";
		case GL_RGBA16UI:
			return "rgba16ui";
		case GL_RGB10_A2UI:
			return "rgb10_a2ui";
		case GL_RGBA8UI:
			return "rgba8ui";
		case GL_RG32UI:
			return "rg32ui";
		case GL_RG16UI:
			return "rg16ui";
		case GL_RG8UI:
			return "rg8ui";
		case GL_R32UI:
			return "r32ui";
		case GL_R16UI:
			return "r16ui";
		case GL_R8UI:
			return "r8ui";

		case GL_RGBA32I:
			return "rgba32i";
		case GL_RGBA16I:
			return "rgba16i";
		case GL_RGBA8I:
			return "rgba8i";
		case GL_RG32I:
			return "rg32i";
		case GL_RG16I:
			return "rg16i";
		case GL_RG8I:
			return "rg8i";
		case GL_R32I:
			return "r32i";
		case GL_R16I:
			return "r16i";
		case GL_R8I:
			return "r8i";

		case GL_RGBA16:
			return "rgba16";
		case GL_RGB10_A2:
			return "rgb10_a2";
		case GL_RGBA8:
			return "rgba8";
		case GL_RG16:
			return "rg16";
		case GL_RG8:
			return "rg8";
		case GL_R16:
			return "r16";
		case GL_R8:
			return "r8";

		case GL_RGBA16_SNORM:
			return "rgba16_snorm";
		case GL_RGBA8_SNORM:
			return "rgba8_snorm";
		case GL_RG16_SNORM:
			return "rg16_snorm";
		case GL_RG8_SNORM:
			return "rg8_snorm";
		case GL_R16_SNORM:
			return "r16_snorm";
		case GL_R8_SNORM:
			return "r8_snorm";
		}

		assert(0);
		return "";
	}